

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O0

double reduce(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *mtrx,double ss)

{
  pointer *this;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pdVar6;
  double dVar7;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_228;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_220;
  iterator it_1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_210;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_208;
  iterator it;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1f8;
  const_iterator local_1f0;
  double *local_1e0;
  double *local_1d8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1d0;
  const_iterator local_1c8;
  double *local_1c0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1b8;
  const_iterator local_1b0;
  double *local_1a0;
  double *local_198;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_190;
  const_iterator local_188;
  int local_180;
  int local_17c;
  int i_3;
  int j_3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_170;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_168;
  double *local_160;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_158;
  const_iterator local_150;
  double *local_140;
  double *local_138;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_130;
  const_iterator local_128;
  value_type local_120;
  int local_118;
  int local_114;
  int i_2;
  int j_2;
  int j_1;
  int i_1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_100;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_f8;
  double *local_f0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_e8;
  const_iterator local_e0;
  double *local_d0;
  double *local_c8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_c0;
  const_iterator local_b8;
  int local_a0;
  int local_9c;
  int j;
  int i;
  double lower_bound;
  vector<double,_std::allocator<double>_> vec_help1;
  vector<double,_std::allocator<double>_> vec_sum;
  vector<double,_std::allocator<double>_> vec_help;
  vector<double,_std::allocator<double>_> vec2;
  vector<double,_std::allocator<double>_> vec1;
  double ss_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *mtrx_local;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&lower_bound);
  _j = 0.0;
  local_9c = 0;
  while( true ) {
    uVar2 = (ulong)local_9c;
    sVar3 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(mtrx);
    if (sVar3 <= uVar2) break;
    local_a0 = 0;
    while( true ) {
      uVar2 = (ulong)local_a0;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](mtrx,(long)local_9c);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
      if (sVar3 <= uVar2) break;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](mtrx,(long)local_9c);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_a0);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&lower_bound,pvVar5);
      local_a0 = local_a0 + 1;
    }
    local_c8 = (double *)
               std::begin<std::vector<double,std::allocator<double>>>
                         ((vector<double,_std::allocator<double>_> *)&lower_bound);
    local_d0 = (double *)
               std::end<std::vector<double,std::allocator<double>>>
                         ((vector<double,_std::allocator<double>_> *)&lower_bound);
    local_c0 = std::
               remove_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,reduce(std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>&,double)::__0>
                         (local_c8,local_d0);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_b8,&local_c0);
    local_e8._M_current =
         (double *)
         std::end<std::vector<double,std::allocator<double>>>
                   ((vector<double,_std::allocator<double>_> *)&lower_bound);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_e0,&local_e8);
    local_f0 = (double *)
               std::vector<double,_std::allocator<double>_>::erase
                         ((vector<double,_std::allocator<double>_> *)&lower_bound,local_b8,local_e0)
    ;
    local_100._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)&lower_bound);
    _j_1 = std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)&lower_bound);
    local_f8 = std::
               min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         (local_100,_j_1);
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_f8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pdVar6);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)&lower_bound);
    local_9c = local_9c + 1;
  }
  j_2 = 0;
  while( true ) {
    uVar2 = (ulong)j_2;
    sVar3 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(mtrx);
    if (sVar3 <= uVar2) break;
    i_2 = 0;
    while( true ) {
      uVar2 = (ulong)i_2;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](mtrx,(long)j_2);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
      if (sVar3 <= uVar2) break;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)j_2);
      dVar7 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](mtrx,(long)j_2);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)i_2);
      *pvVar5 = *pvVar5 - dVar7;
      i_2 = i_2 + 1;
    }
    j_2 = j_2 + 1;
  }
  local_114 = 0;
  while( true ) {
    uVar2 = (ulong)local_114;
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](mtrx,0);
    sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
    if (sVar3 <= uVar2) break;
    local_118 = 0;
    while( true ) {
      uVar2 = (ulong)local_118;
      sVar3 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(mtrx);
      if (sVar3 <= uVar2) break;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](mtrx,(long)local_118);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_114);
      if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) {
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](mtrx,(long)local_118);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_114);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   &vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pvVar5);
      }
      else {
        local_120 = 0.0;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   &vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_120);
      }
      local_118 = local_118 + 1;
    }
    local_138 = (double *)
                std::begin<std::vector<double,std::allocator<double>>>
                          ((vector<double,_std::allocator<double>_> *)
                           &vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    local_140 = (double *)
                std::end<std::vector<double,std::allocator<double>>>
                          ((vector<double,_std::allocator<double>_> *)
                           &vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    local_130 = std::
                remove_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,reduce(std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>&,double)::__1>
                          (local_138,local_140);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_128,&local_130);
    local_158._M_current =
         (double *)
         std::end<std::vector<double,std::allocator<double>>>
                   ((vector<double,_std::allocator<double>_> *)
                    &vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_150,&local_158);
    local_160 = (double *)
                std::vector<double,_std::allocator<double>_>::erase
                          ((vector<double,_std::allocator<double>_> *)
                           &vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_128,local_150);
    this = &vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    local_170._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)this);
    _i_3 = std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)this);
    local_168 = std::
                min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                          (local_170,_i_3);
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_168);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pdVar6);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)
               &vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_114 = local_114 + 1;
  }
  local_17c = 0;
  while( true ) {
    uVar2 = (ulong)local_17c;
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](mtrx,0);
    sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
    if (sVar3 <= uVar2) break;
    local_180 = 0;
    while( true ) {
      uVar2 = (ulong)local_180;
      sVar3 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(mtrx);
      if (sVar3 <= uVar2) break;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_17c);
      dVar7 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](mtrx,(long)local_180);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_17c);
      *pvVar5 = *pvVar5 - dVar7;
      local_180 = local_180 + 1;
    }
    local_17c = local_17c + 1;
  }
  local_198 = (double *)
              std::begin<std::vector<double,std::allocator<double>>>
                        ((vector<double,_std::allocator<double>_> *)
                         &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  local_1a0 = (double *)
              std::end<std::vector<double,std::allocator<double>>>
                        ((vector<double,_std::allocator<double>_> *)
                         &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  local_190 = std::
              remove_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,reduce(std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>&,double)::__2>
                        (local_198,local_1a0);
  __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
  __normal_iterator<double*>
            ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
             &local_188,&local_190);
  local_1b8._M_current =
       (double *)
       std::end<std::vector<double,std::allocator<double>>>
                 ((vector<double,_std::allocator<double>_> *)
                  &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
  __normal_iterator<double*>
            ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
             &local_1b0,&local_1b8);
  local_1c0 = (double *)
              std::vector<double,_std::allocator<double>_>::erase
                        ((vector<double,_std::allocator<double>_> *)
                         &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,local_188,local_1b0);
  local_1d8 = (double *)
              std::begin<std::vector<double,std::allocator<double>>>
                        ((vector<double,_std::allocator<double>_> *)
                         &vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  local_1e0 = (double *)
              std::end<std::vector<double,std::allocator<double>>>
                        ((vector<double,_std::allocator<double>_> *)
                         &vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  local_1d0 = std::
              remove_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,reduce(std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>&,double)::__3>
                        (local_1d8,local_1e0);
  __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
  __normal_iterator<double*>
            ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
             &local_1c8,&local_1d0);
  local_1f8._M_current =
       (double *)
       std::end<std::vector<double,std::allocator<double>>>
                 ((vector<double,_std::allocator<double>_> *)
                  &vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
  __normal_iterator<double*>
            ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
             &local_1f0,&local_1f8);
  it = std::vector<double,_std::allocator<double>_>::erase
                 ((vector<double,_std::allocator<double>_> *)
                  &vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,local_1c8,local_1f0);
  local_208._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)
                  &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_210._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)
                    &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    bVar1 = __gnu_cxx::operator!=(&local_208,&local_210);
    if (!bVar1) break;
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_208);
    _j = *pdVar6 + _j;
    it_1._M_current =
         (double *)
         __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
         operator++(&local_208,0);
  }
  local_220._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)
                  &vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_228._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)
                    &vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    bVar1 = __gnu_cxx::operator!=(&local_220,&local_228);
    if (!bVar1) break;
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_220);
    _j = *pdVar6 + _j;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_220,0);
  }
  dVar7 = _j + ss;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&lower_bound);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &vec_help1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &vec_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &vec_help.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return dVar7;
}

Assistant:

double reduce(std::vector<std::vector<double>>& mtrx, double ss){

    std::vector<double> vec1,vec2,vec_help,vec_sum,vec_help1;
    double lower_bound = 0;

    for(int i=0; i<mtrx.size();i++){
        for (int j=0; j<mtrx[i].size(); j++){
            vec_help1.push_back(mtrx[i][j]);
        }
        vec_help1.erase(std::remove_if(std::begin(vec_help1),std::end(vec_help1), [](const auto& value) {return std::isnan(value);}),std::end(vec_help1));
        vec1.push_back(*std::min_element(vec_help1.begin(),vec_help1.end()));
        vec_help1.clear();
    }


    for(int i=0; i<mtrx.size();i++){
        for(int j=0; j<mtrx[i].size();j++){
            mtrx[i][j] -= vec1[i];
        }
    }

    for(int j=0; j<mtrx[0].size();j++){
        for(int i=0; i<mtrx.size();i++){
            if (mtrx[i][j]==0) {vec_help.push_back(0); continue;}
            else{
                vec_help.push_back(mtrx[i][j]);
            }
        }
        vec_help.erase(std::remove_if(std::begin(vec_help),std::end(vec_help), [](const auto& value) {return std::isnan(value);}),std::end(vec_help));
        vec2.push_back(*std::min_element(vec_help.begin(),vec_help.end()));
        vec_help.clear();
    }


    for(int j=0; j<mtrx[0].size();j++){
        for(int i=0; i<mtrx.size();i++){
            mtrx[i][j] -= vec2[j];
        }
    }


    vec1.erase(std::remove_if(std::begin(vec1),std::end(vec1), [](const auto& value) {return std::isnan(value);}),std::end(vec1));
    vec2.erase(std::remove_if(std::begin(vec2),std::end(vec2), [](const auto& value) {return std::isnan(value);}),std::end(vec2));


     for(std::vector<double>::iterator it = vec1.begin(); it!= vec1.end(); it++){
         lower_bound += *it;
     }
     for(std::vector<double>::iterator it = vec2.begin(); it!= vec2.end(); it++){
        lower_bound += *it;
     }
    return lower_bound + ss;
}